

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall bpwriter::format_roman(bpwriter *this,vm_val_t *val,fmtopts *opts,int flags)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t len;
  char *pcVar4;
  int iVar5;
  size_t ri;
  ulong uVar6;
  char buf [40];
  char local_58 [40];
  
  if (val->typ == VM_INT) {
    iVar2 = (val->val).intval;
  }
  else {
    iVar2 = vm_val_t::nonint_cast_to_int(val);
  }
  if (iVar2 - 1U < 4999) {
    uVar6 = 0;
    do {
      iVar5 = iVar2 - format_roman::r[uVar6].val;
      if (iVar2 < format_roman::r[uVar6].val) {
        uVar6 = uVar6 + 1;
      }
      else {
        pcVar4 = format_roman::r[uVar6].numeral;
        cVar1 = *pcVar4;
        while (iVar2 = iVar5, cVar1 != '\0') {
          pcVar4 = pcVar4 + 1;
          if ((flags & 2U) != 0) {
            iVar2 = toupper((int)cVar1);
            cVar1 = (char)iVar2;
          }
          local_58[0] = cVar1;
          pcVar3 = CVmObjString::cons_append(this->str,this->dst,local_58,1,0x40);
          this->dst = pcVar3;
          cVar1 = *pcVar4;
        }
      }
    } while ((iVar2 != 0) && (uVar6 < 0xc));
  }
  else {
    t3sprintf(local_58,0x28,"%ld");
    len = strlen(local_58);
    format_int(this,local_58,len,(char *)0x0,opts,0);
  }
  return;
}

Assistant:

void format_roman(VMG_ const vm_val_t *val, const fmtopts &opts, int flags)
    {
        char buf[40];

        /* get the integer value */
        int32_t i = val->cast_to_int(vmg0_);

        /* 
         *   use Roman numerals if it's in the range 1-4999, otherwise just
         *   treat it like '%d' 
         */
        if (i >= 1 && i <= 4999)
        {
            /* Roman numeral conversion chart */
            static const struct
            {
                const char *numeral;
                int val;
            } r[] =
            {
                { "m", 1000 },
                { "cm", 900 },
                { "d", 500 },
                { "cd", 400 },
                { "c", 100 },
                { "xc", 90 },
                { "l", 50 },
                { "x", 10 },
                { "ix", 9 },
                { "v", 5 },
                { "iv", 4 },
                { "i", 1 }
            };

            /* 
             *   convert by repeatedly appending the highest-value Roman
             *   numeral less than or equal to the number, deducting each
             *   Roman numeral value from the remaining number balance until
             *   we reach zero
             */
            for (size_t ri = 0 ; i != 0 && ri < countof(r) ; )
            {
                /* if this one fits, append this Roman numeral */
                if (r[ri].val <= i)
                {
                    /* append this numeral, converting case if needed */
                    for (const char *p = r[ri].numeral ; *p != 0 ; ++p)
                    {
                        if ((flags & FI_CAPS) != 0)
                            putch((char)toupper(*p));
                        else
                            putch(*p);
                    }
                    
                    /* deduct its value from the remaining balance */
                    i -= r[ri].val;
                }
                else
                {
                    /* this numeral is too large - move on to the next one */
                    ++ri;
                }
            }
        }
        else
        {
            t3sprintf(buf, sizeof(buf), "%ld", (long)i);
            format_int(vmg_ buf, strlen(buf), 0, opts, 0);
        }
    }

    /* format a floating-point value */
    void format_float(VMG_ const vm_val_t *val, char type_spec,
                      const fmtopts &opts)
    {
        /* a stack buffer for conversions that can use it */
        char buf[256];

        /* 
         *   Use the precision specified, with a default of 6 digits; assume
         *   that there's no maximum number of digits. 
         */
        int prec = (opts.prec >= 0 ? opts.prec : 6);
        int maxdigs = -1;

        /* figure the formatter flags */
        ulong flags = VMBN_FORMAT_LEADING_ZERO;

        /* if the sign option is set, always show a sign */
        if (opts.sign == '+')
            flags |= VMBN_FORMAT_SIGN;
        else if (opts.sign == ' ')
            flags |= VMBN_FORMAT_POS_SPACE;

        /* 
         *   if the '#' flag is set, always show a decimal point, and keep
         *   trailing zeros with 'g' and 'G' 
         */
        if (opts.pound)
        {
            flags |= VMBN_FORMAT_POINT;
            if (type_spec == 'g' || type_spec == 'G')
                flags |= VMBN_FORMAT_TRAILING_ZEROS;
        }

        /* for 'E' or 'G', use capital 'E' for the exponent indicator */
        if (type_spec == 'E' || type_spec == 'G')
            flags |= VMBN_FORMAT_EXP_CAP;

        /* 
         *   for 'e' or 'E', always use scientific notation, with a sign
         *   symbol in the exponent value 
         */
        if (type_spec == 'e' || type_spec == 'E')
            flags |= VMBN_FORMAT_EXP | VMBN_FORMAT_EXP_SIGN;

        /* if the type code is 'g' or 'G', use "compact" notation */
        if (type_spec == 'g' || type_spec == 'G')
        {
            /* set the compact notation flag */
            flags |= VMBN_FORMAT_COMPACT | VMBN_FORMAT_EXP_SIGN;

            /* the precision is the number of significant digits to show */
            flags |= VMBN_FORMAT_MAXSIG;
            maxdigs = prec;
            prec = -1;
        }

        /* cast the value to a numeric type */
        vm_val_t num;
        val->cast_to_num(vmg_ &num);
        G_stk->push(&num);

        /* check the type */
        switch (num.typ)
        {
        case VM_INT:
            {
                /* format the integer as though it were a float */
                const char *p = CVmObjBigNum::cvt_int_to_string_buf(
                    buf, sizeof(buf), num.val.intval,
                    maxdigs, -1, prec, 3, flags);
                
                /* write it out, adding padding and alignment */
                format_with_padding(vmg_ p, opts);
            }
            break;

        case VM_OBJ:
            /* if it's an object, it should be a BigNumber */
            if (CVmObjBigNum::is_bignum_obj(vmg_ num.val.obj))
            {
                /* get the BigNumber object */
                CVmObjBigNum *bn = (CVmObjBigNum *)vm_objp(vmg_ num.val.obj);

                /* format the BigNumber */
                vm_val_t str;
                const char *p = bn->cvt_to_string_buf(
                    vmg_ &str, buf, sizeof(buf),
                    maxdigs, -1, prec, 3, flags);
                G_stk->push(&str);

                /* write it out, adding padding and alignment */
                format_with_padding(vmg_ p, opts);

                /* discard gc protection */
                G_stk->discard();
            }
            break;

        default:
            break;
        }

        /* discard our gc protection */
        G_stk->discard();
    }

    /* result string */
    CVmObjString *str;

    /* current write pointer */
    char *dst;

    /* VM globals */
    vm_globals *vmg;
}